

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_parse_w(archive_acl *acl,wchar_t *text,wchar_t default_type)

{
  ulong uVar1;
  anon_struct_16_2_267fbce2 *paVar2;
  int iVar3;
  wchar_t wVar4;
  ulong uVar5;
  wchar_t *pwVar6;
  anon_struct_16_2_267fbce2 *paVar7;
  uint uVar8;
  ulong uVar9;
  wchar_t *pwVar10;
  wchar_t *pwVar11;
  ulong uVar12;
  wchar_t local_9c;
  wchar_t id;
  wchar_t permset;
  wchar_t *local_90;
  wchar_t *local_88;
  wchar_t local_7c;
  anon_struct_16_2_267fbce2 field [4];
  
  local_7c = default_type;
  do {
    if ((text == (wchar_t *)0x0) || (*text == L'\0')) {
      return L'\0';
    }
    uVar9 = 0;
    uVar1 = 1;
    paVar2 = field + 1;
    do {
      while ((paVar7 = paVar2, uVar5 = uVar1, uVar12 = uVar9, uVar9 = (ulong)(uint)*text,
             pwVar6 = text, uVar9 < 0x21 && ((0x100000600U >> (uVar9 & 0x3f) & 1) != 0))) {
        text = text + 1;
        uVar9 = uVar12;
        uVar1 = uVar5;
        paVar2 = paVar7;
      }
      while ((uVar8 = (uint)uVar9, 0x3a < uVar8 ||
             (pwVar11 = pwVar6, (0x400100000000401U >> (uVar9 & 0x3f) & 1) == 0))) {
        uVar9 = (ulong)(uint)pwVar6[1];
        pwVar6 = pwVar6 + 1;
      }
      do {
        pwVar10 = pwVar11;
        if (0x20 < (ulong)(uint)pwVar10[-1]) break;
        pwVar11 = pwVar10 + -1;
      } while ((0x100000600U >> ((ulong)(uint)pwVar10[-1] & 0x3f) & 1) != 0);
      if (uVar12 < 4) {
        field[uVar12].start = text;
        field[uVar12].end = pwVar10;
      }
      text = pwVar6 + (uVar8 != 0);
      uVar9 = uVar12 + 1;
      uVar1 = uVar5 + 1;
      paVar2 = paVar7 + 1;
    } while (uVar8 == 0x3a);
    text = pwVar6 + (uVar8 != 0);
    for (; uVar5 < 4; uVar5 = uVar5 + 1) {
      paVar7->start = (wchar_t *)0x0;
      paVar7->end = (wchar_t *)0x0;
      paVar7 = paVar7 + 1;
    }
    id = L'\xffffffff';
    local_90 = field[1].start;
    local_88 = field[1].end;
    isint_w(field[1].start,field[1].end,&id);
    if (2 < uVar12 && id == L'\xffffffff') {
      isint_w(field[3].start,field[3].end,&id);
    }
    pwVar11 = field[0].end;
    pwVar6 = field[0].start;
    if (((long)field[0].end - (long)field[0].start < 0x1d) ||
       (iVar3 = wmemcmp(field[0].start,anon_var_dwarf_9169be,7), iVar3 != 0)) {
      local_9c = local_7c;
    }
    else {
      pwVar6 = pwVar6 + 7;
      local_9c = L'Ȁ';
      field[0].start = pwVar6;
    }
    wVar4 = prefix_w(pwVar6,pwVar11,anon_var_dwarf_9169d5);
    if (wVar4 == L'\0') {
      wVar4 = prefix_w(pwVar6,pwVar11,anon_var_dwarf_9169ec);
      if (wVar4 == L'\0') {
        wVar4 = prefix_w(pwVar6,pwVar11,anon_var_dwarf_916a03);
        iVar3 = (int)uVar12;
        if (wVar4 == L'\0') {
          wVar4 = prefix_w(pwVar6,pwVar11,anon_var_dwarf_916a0e);
          if (wVar4 == L'\0') {
            return L'\xffffffec';
          }
          if (iVar3 == 2) {
            pwVar6 = field[2].end;
            pwVar11 = field[2].start;
            if (local_90 != local_88) {
              return L'\xffffffec';
            }
          }
          else {
            pwVar6 = local_88;
            pwVar11 = local_90;
            if (iVar3 != 1) {
              return L'\xffffffec';
            }
          }
          if (pwVar6 <= pwVar11) {
            return L'\xffffffec';
          }
          wVar4 = ismode_w(pwVar11,pwVar6,&permset);
          if (wVar4 == L'\0') {
            return L'\xffffffec';
          }
          wVar4 = L'✕';
        }
        else {
          if (iVar3 == 2) {
            pwVar6 = field[2].end;
            pwVar11 = field[2].start;
            if (local_90 != local_88) {
              return L'\xffffffec';
            }
          }
          else {
            pwVar6 = local_88;
            pwVar11 = local_90;
            if (iVar3 != 1) {
              return L'\xffffffec';
            }
          }
          if (pwVar6 <= pwVar11) {
            return L'\xffffffec';
          }
          wVar4 = ismode_w(pwVar11,pwVar6,&permset);
          if (wVar4 == L'\0') {
            return L'\xffffffec';
          }
          wVar4 = L'✖';
        }
      }
      else {
        wVar4 = ismode_w(field[2].start,field[2].end,&permset);
        if (wVar4 == L'\0') {
          return L'\xffffffec';
        }
        if ((local_90 < local_88) || (id != L'\xffffffff')) {
          wVar4 = L'✓';
          pwVar6 = local_88;
          pwVar11 = local_90;
          goto LAB_00415e66;
        }
        wVar4 = L'✔';
      }
LAB_00415e61:
      pwVar6 = (wchar_t *)0x0;
      pwVar11 = (wchar_t *)0x0;
    }
    else {
      wVar4 = ismode_w(field[2].start,field[2].end,&permset);
      if (wVar4 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_88 <= local_90) && (id == L'\xffffffff')) {
        wVar4 = L'✒';
        goto LAB_00415e61;
      }
      wVar4 = L'✑';
      pwVar6 = local_88;
      pwVar11 = local_90;
    }
LAB_00415e66:
    archive_acl_add_entry_w_len
              (acl,local_9c,permset,wVar4,id,pwVar11,(long)pwVar6 - (long)pwVar11 >> 2);
  } while( true );
}

Assistant:

int
archive_acl_parse_w(struct archive_acl *acl,
    const wchar_t *text, int default_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[4], name;

	int fields, n;
	int type, tag, permset, id;
	wchar_t sep;

	while (text != NULL  &&  *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint_w(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint_w(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && wmemcmp(field[0].start, L"default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_w(field[0].start, field[0].end, L"user")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"group")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_w(field[0].start, field[0].end, L"mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
	}
	return (ARCHIVE_OK);
}